

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ResolutionPass.h
# Opt level: O2

void __thiscall
soul::ResolutionPass::FunctionResolver::PossibleFunction::PossibleFunction
          (PossibleFunction *this,Function *f,ArrayView<soul::Type> argTypes,
          ArrayView<soul::pool_ptr<soul::AST::Constant>_> constantArgValues)

{
  bool bVar1;
  Type *pTVar2;
  pool_ptr<soul::AST::Constant> *ppVar3;
  Constant *pCVar4;
  ulong i;
  ArrayView<soul::Type> argTypes_local;
  ArrayView<soul::pool_ptr<soul::AST::Constant>_> constantArgValues_local;
  Type targetParamType;
  Type local_48;
  
  constantArgValues_local.e = constantArgValues.e;
  constantArgValues_local.s = constantArgValues.s;
  argTypes_local.e = argTypes.e;
  argTypes_local.s = argTypes.s;
  this->function = f;
  this->isImpossible = false;
  this->requiresCast = false;
  this->requiresGeneric = false;
  this->functionIsNotResolved = false;
  i = 0;
  do {
    if ((ulong)(((long)argTypes_local.e - (long)argTypes_local.s) / 0x18) <= i) {
      return;
    }
    targetParamType.structure.object = (Structure *)0x0;
    targetParamType.category = invalid;
    targetParamType.arrayElementCategory = invalid;
    targetParamType.isRef = false;
    targetParamType.isConstant = false;
    targetParamType.primitiveType.type = invalid;
    targetParamType.boundingSize = 0;
    targetParamType.arrayElementBoundingSize = 0;
    bVar1 = AST::VariableDeclaration::isResolved
                      ((this->function->parameters).
                       super__Vector_base<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[i].object);
    if (bVar1) {
      AST::VariableDeclaration::getType
                (&local_48,
                 (this->function->parameters).
                 super__Vector_base<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[i].object);
      Type::operator=(&targetParamType,&local_48);
      RefCountedPtr<soul::Structure>::~RefCountedPtr(&local_48.structure);
      pTVar2 = ArrayView<soul::Type>::operator[](&argTypes_local,i);
      bVar1 = TypeRules::canPassAsArgumentTo(&targetParamType,pTVar2,true);
      if (!bVar1) {
        pTVar2 = ArrayView<soul::Type>::operator[](&argTypes_local,i);
        bVar1 = TypeRules::canPassAsArgumentTo(&targetParamType,pTVar2,false);
        if (!bVar1) {
          ppVar3 = ArrayView<soul::pool_ptr<soul::AST::Constant>_>::operator[]
                             (&constantArgValues_local,i);
          if (ppVar3->object != (Constant *)0x0) {
            ppVar3 = ArrayView<soul::pool_ptr<soul::AST::Constant>_>::operator[]
                               (&constantArgValues_local,i);
            pCVar4 = pool_ptr<soul::AST::Constant>::operator->(ppVar3);
            bVar1 = TypeRules::canSilentlyCastTo(&targetParamType,&pCVar4->value);
            if (bVar1) goto LAB_0024ba12;
          }
          this->isImpossible = true;
        }
LAB_0024ba12:
        this->requiresCast = true;
      }
    }
    else if ((this->function->genericWildcards).
             super__Vector_base<soul::pool_ref<soul::AST::UnqualifiedName>,_std::allocator<soul::pool_ref<soul::AST::UnqualifiedName>_>_>
             ._M_impl.super__Vector_impl_data._M_start ==
             (this->function->genericWildcards).
             super__Vector_base<soul::pool_ref<soul::AST::UnqualifiedName>,_std::allocator<soul::pool_ref<soul::AST::UnqualifiedName>_>_>
             ._M_impl.super__Vector_impl_data._M_finish) {
      this->functionIsNotResolved = true;
    }
    else {
      this->requiresGeneric = true;
    }
    RefCountedPtr<soul::Structure>::~RefCountedPtr(&targetParamType.structure);
    i = i + 1;
  } while( true );
}

Assistant:

PossibleFunction (AST::Function& f, ArrayView<Type> argTypes,
                              ArrayView<pool_ptr<AST::Constant>> constantArgValues)
                : function (f)
            {
                for (size_t i = 0; i < argTypes.size(); ++i)
                {
                    Type targetParamType;

                    if (! function.parameters[i]->isResolved())
                    {
                        if (function.isGeneric())
                            requiresGeneric = true;
                        else
                            functionIsNotResolved = true;

                        continue;
                    }

                    targetParamType = function.parameters[i]->getType();

                    if (TypeRules::canPassAsArgumentTo (targetParamType, argTypes[i], true))
                        continue;

                    if (! TypeRules::canPassAsArgumentTo (targetParamType, argTypes[i], false))
                    {
                        if (constantArgValues[i] == nullptr
                             || ! TypeRules::canSilentlyCastTo (targetParamType, constantArgValues[i]->value))
                            isImpossible = true;
                    }

                    requiresCast = true;
                }
            }